

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O1

void __thiscall CcsTest_DomainBuilder_Test::TestBody(CcsTest_DomainBuilder_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  fd_set *__writefds;
  fd_set *in_R8;
  char *pcVar3;
  timeval *in_R9;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  CcsDomain ccs;
  CcsContext ctx;
  string local_2b8;
  undefined1 local_298 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  undefined1 local_278 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  undefined1 local_258 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  long local_248 [2];
  string local_238;
  CcsDomain local_218;
  string local_210;
  undefined1 local_1f0 [32];
  string local_1d0;
  string local_1b0;
  RuleBuilder local_190;
  string local_180;
  RuleBuilder local_160;
  string local_150;
  long *local_130 [2];
  long local_120 [2];
  string local_110;
  string local_f0;
  undefined1 local_d0 [32];
  long *local_b0;
  long local_a0 [2];
  string local_90;
  undefined1 local_70 [24];
  undefined1 local_58 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  ::ccs::CcsDomain::CcsDomain(&local_218,false);
  ::ccs::CcsDomain::ruleBuilder((CcsDomain *)&local_1d0);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"a","");
  local_298 = (undefined1  [8])&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"base","");
  ::ccs::RuleBuilder::set((RuleBuilder *)&local_1d0.field_2,&local_1d0,&local_2b8);
  local_278 = (undefined1  [8])&local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"a","");
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"b","");
  anon_unknown.dwarf_40e21::v
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_58,&local_238);
  ::ccs::RuleBuilder::select
            ((RuleBuilder *)&local_1b0,(int)&local_1d0 + 0x10,(fd_set *)local_278,(fd_set *)local_58
             ,in_R8,in_R9);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"a","");
  local_258 = (undefined1  [8])local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"123","");
  __writefds = (fd_set *)local_258;
  ::ccs::RuleBuilder::set((RuleBuilder *)&local_1b0.field_2,&local_1b0,&local_210);
  ::ccs::RuleBuilder::pop(&local_190);
  local_1f0._0_8_ = local_1f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"c","");
  ::ccs::RuleBuilder::select
            ((RuleBuilder *)&local_180,(int)&local_190,(fd_set *)local_1f0,__writefds,in_R8,in_R9);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"b","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"true","");
  ::ccs::RuleBuilder::set((RuleBuilder *)&local_180.field_2,&local_180,&local_90);
  ::ccs::RuleBuilder::pop(&local_160);
  local_d0._0_8_ = local_d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"c","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"d","");
  anon_unknown.dwarf_40e21::v
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_70,&local_f0);
  ::ccs::RuleBuilder::select
            ((RuleBuilder *)&local_150,(int)&local_160,(fd_set *)local_d0,(fd_set *)local_70,in_R8,
             in_R9);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"b","");
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"false","");
  ::ccs::RuleBuilder::set((RuleBuilder *)&local_150.field_2,&local_150,&local_110);
  ::ccs::RuleBuilder::pop((RuleBuilder *)(local_58 + 0x18));
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.field_2._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.field_2._8_8_);
  }
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  paVar1 = &local_2b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._M_string_length);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  if (local_160.impl.super___shared_ptr<ccs::RuleBuilder::Impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_160.impl.super___shared_ptr<ccs::RuleBuilder::Impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180.field_2._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180.field_2._8_8_);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._M_string_length);
  }
  if ((element_type *)local_1f0._0_8_ != (element_type *)(local_1f0 + 0x10)) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  if (local_190.impl.super___shared_ptr<ccs::RuleBuilder::Impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_190.impl.super___shared_ptr<ccs::RuleBuilder::Impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0.field_2._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0.field_2._8_8_);
  }
  if (local_258 != (undefined1  [8])local_248) {
    operator_delete((void *)local_258,local_248[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._M_string_length);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if (local_278 != (undefined1  [8])&local_268) {
    operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0.field_2._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0.field_2._8_8_);
  }
  if (local_298 != (undefined1  [8])&local_288) {
    operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length);
  }
  ::ccs::CcsDomain::build((CcsDomain *)&local_210);
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"a","");
  psVar2 = ::ccs::CcsContext::getString((CcsContext *)&local_210,&local_2b8);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)local_298,"\"base\"","ctx.getString(\"a\")",(char (*) [5])"base",psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (local_298[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_2b8);
    if (local_290 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_290->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xc1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_278,(Message *)&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_2b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_290,local_290);
  }
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"a","");
  local_298 = (undefined1  [8])&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"b","");
  anon_unknown.dwarf_40e21::v
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_238,(string *)local_298);
  ::ccs::CcsContext::CcsContext
            ((CcsContext *)local_1f0,(CcsContext *)&local_210,&local_2b8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_238);
  local_278 = (undefined1  [8])&local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"a","");
  psVar2 = ::ccs::CcsContext::getString((CcsContext *)local_1f0,(string *)local_278);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)local_258,"\"123\"","ctx.constrain(\"a\", v(\"b\")).getString(\"a\")",
             (char (*) [4])0x17e7ae,psVar2);
  if (local_278 != (undefined1  [8])&local_268) {
    operator_delete((void *)local_278,local_268._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._8_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_238);
  if (local_298 != (undefined1  [8])&local_288) {
    operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (local_258[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_2b8);
    if (local_250 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_250->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xc2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_2b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_250 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_250,local_250);
  }
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"c","");
  ::ccs::CcsContext::CcsContext((CcsContext *)&local_238,(CcsContext *)&local_210,&local_2b8);
  local_298 = (undefined1  [8])&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"a","");
  psVar2 = ::ccs::CcsContext::getString((CcsContext *)&local_238,(string *)local_298);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)local_278,"\"base\"","ctx.constrain(\"c\").getString(\"a\")",
             (char (*) [5])"base",psVar2);
  if (local_298 != (undefined1  [8])&local_288) {
    operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (local_278[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_2b8);
    if (local_270 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_270->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xc3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_2b8._M_dataplus._M_p + 8))();
    }
  }
  if (local_270 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_270,local_270);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._M_string_length);
  }
  ::ccs::CcsDomain::~CcsDomain(&local_218);
  return;
}

Assistant:

TEST(CcsTest, DomainBuilder) {
  CcsDomain ccs;
  ccs.ruleBuilder()
      .set("a", "base")
      .select("a", v("b")).set("a", "123").pop()
      .select("c").set("b", "true").pop()
      .select("c", v("d")).set("b", "false").pop();
  CcsContext ctx = ccs.build();
  EXPECT_EQ("base", ctx.getString("a"));
  EXPECT_EQ("123", ctx.constrain("a", v("b")).getString("a"));
  EXPECT_EQ("base", ctx.constrain("c").getString("a"));
}